

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# overlay.cpp
# Opt level: O2

void __thiscall r_exec::Overlay::unpatch_code(Overlay *this,uint16_t patch_index)

{
  pointer puVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  ulong uVar4;
  long lVar5;
  
  uVar4 = (ulong)patch_index;
  iVar2 = (*(this->controller->super__Object)._vptr__Object[4])();
  lVar3 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x20))
                    ((long *)CONCAT44(extraout_var,iVar2),0);
  while( true ) {
    uVar4 = uVar4 & 0xffff;
    puVar1 = (this->patch_indices).
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->patch_indices).
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar1 >> 1) <= uVar4) break;
    lVar5 = (ulong)puVar1[uVar4] * 4;
    r_code::Atom::operator=(this->code + lVar5,(Atom *)(lVar3 + lVar5));
    uVar4 = (ulong)((int)uVar4 + 1);
  }
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (&this->patch_indices,(ulong)patch_index);
  return;
}

Assistant:

void Overlay::unpatch_code(uint16_t patch_index)
{
    Code *object = get_core_object();
    Atom *original_code = &object->code(0);

    for (uint16_t i = patch_index; i < patch_indices.size(); ++i) {
        code[patch_indices[i]] = original_code[patch_indices[i]];
    }

    patch_indices.resize(patch_index);
}